

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_doing(connectdata *conn,_Bool *dophase_done)

{
  Curl_easy *data;
  CURLcode CVar1;
  int iVar2;
  curltime now;
  
  CVar1 = tftp_multi_statemach(conn,dophase_done);
  if (CVar1 == CURLE_OK && *dophase_done == false) {
    iVar2 = Curl_pgrsUpdate(conn);
    if (iVar2 == 0) {
      data = conn->data;
      now = Curl_now();
      CVar1 = Curl_speedcheck(data,now);
      return CVar1;
    }
    CVar1 = CURLE_ABORTED_BY_CALLBACK;
  }
  return CVar1;
}

Assistant:

static CURLcode tftp_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result;
  result = tftp_multi_statemach(conn, dophase_done);

  if(*dophase_done) {
    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }
  else if(!result) {
    /* The multi code doesn't have this logic for the DOING state so we
       provide it for TFTP since it may do the entire transfer in this
       state. */
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(conn->data, Curl_now());
  }
  return result;
}